

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_int16 *
ma_dr_flac__full_read_and_close_s16
          (ma_dr_flac *pFlac,uint *channelsOut,uint *sampleRateOut,ma_uint64 *totalPCMFrameCountOut)

{
  ma_allocation_callbacks *pAllocationCallbacks;
  ma_int16 *pBufferOut;
  ma_uint64 mVar1;
  ma_uint64 mVar2;
  ma_int16 *pmVar3;
  long lVar4;
  ulong uVar5;
  ma_int16 buffer [4096];
  ulong local_2060;
  ma_int16 local_2038 [4100];
  
  if (pFlac->totalPCMFrameCount == 0) {
    pAllocationCallbacks = &pFlac->allocationCallbacks;
    local_2060 = 0x2000;
    pBufferOut = (ma_int16 *)ma_dr_flac__malloc_from_callbacks(0x2000,pAllocationCallbacks);
    if (pBufferOut == (ma_int16 *)0x0) goto LAB_0015648b;
    mVar1 = 0;
    while (mVar2 = ma_dr_flac_read_pcm_frames_s16
                             (pFlac,(ulong)(ushort)(0x1000 / pFlac->channels),local_2038),
          mVar2 != 0) {
      uVar5 = (ulong)pFlac->channels;
      pmVar3 = pBufferOut;
      if (local_2060 < (mVar2 + mVar1) * uVar5 * 2) {
        pmVar3 = (ma_int16 *)
                 ma_dr_flac__realloc_from_callbacks
                           (pBufferOut,local_2060 * 2,local_2060,pAllocationCallbacks);
        if (pmVar3 == (ma_int16 *)0x0) {
          ma_dr_flac__free_from_callbacks(pBufferOut,pAllocationCallbacks);
          goto LAB_0015648b;
        }
        uVar5 = (ulong)pFlac->channels;
        local_2060 = local_2060 * 2;
      }
      memcpy(pmVar3 + mVar1 * uVar5,local_2038,mVar2 * uVar5 * 2);
      mVar1 = mVar2 + mVar1;
      pBufferOut = pmVar3;
    }
    lVar4 = pFlac->channels * mVar1;
    memset(pBufferOut + lVar4,0,local_2060 + lVar4 * -2);
  }
  else {
    pBufferOut = (ma_int16 *)
                 ma_dr_flac__malloc_from_callbacks
                           (pFlac->totalPCMFrameCount * (ulong)pFlac->channels * 2,
                            &pFlac->allocationCallbacks);
    if (pBufferOut == (ma_int16 *)0x0) {
LAB_0015648b:
      pBufferOut = (ma_int16 *)0x0;
      goto LAB_0015648e;
    }
    mVar1 = ma_dr_flac_read_pcm_frames_s16(pFlac,pFlac->totalPCMFrameCount,pBufferOut);
  }
  if (sampleRateOut != (uint *)0x0) {
    *sampleRateOut = pFlac->sampleRate;
  }
  if (channelsOut != (uint *)0x0) {
    *channelsOut = (uint)pFlac->channels;
  }
  if (totalPCMFrameCountOut != (ma_uint64 *)0x0) {
    *totalPCMFrameCountOut = mVar1;
  }
LAB_0015648e:
  ma_dr_flac_close(pFlac);
  return pBufferOut;
}

Assistant:

ma_int32* ma_dr_flac_open_and_read_pcm_frames_s32(ma_dr_flac_read_proc onRead, ma_dr_flac_seek_proc onSeek, void* pUserData, unsigned int* channelsOut, unsigned int* sampleRateOut, ma_uint64* totalPCMFrameCountOut, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_flac* pFlac;
    if (channelsOut) {
        *channelsOut = 0;
    }
    if (sampleRateOut) {
        *sampleRateOut = 0;
    }
    if (totalPCMFrameCountOut) {
        *totalPCMFrameCountOut = 0;
    }
    pFlac = ma_dr_flac_open(onRead, onSeek, pUserData, pAllocationCallbacks);
    if (pFlac == NULL) {
        return NULL;
    }
    return ma_dr_flac__full_read_and_close_s32(pFlac, channelsOut, sampleRateOut, totalPCMFrameCountOut);
}